

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O1

void G_AddViewPitch(int look)

{
  float fVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  
  if (gamestate != GS_TITLELEVEL) {
    uVar4 = look << 0x10;
    if ((((&DAT_017e5e58)[(long)consoleplayer * 0x2a0] != '\x01') &&
        (*(long *)(&DAT_017e5f20 + (long)consoleplayer * 0x2a0) != 0)) &&
       (fVar1 = *(float *)(*(long *)(&DAT_017e5f20 + (long)consoleplayer * 0x2a0) + 0x598),
       0.0 < fVar1)) {
      uVar4 = (uint)(fVar1 * (float)(int)uVar4);
    }
    bVar3 = FLevelLocals::IsFreelookAllowed(&level);
    iVar2 = 0;
    if (bVar3) {
      if ((int)uVar4 < 1) {
        iVar2 = LocalViewPitch;
        if ((((int)uVar4 < 0) && (iVar2 = -0x78000000, (int)(-0x80000000 - uVar4) <= LocalViewPitch)
            ) && (-0x78000000 < (int)(LocalViewPitch + uVar4))) {
          iVar2 = LocalViewPitch + uVar4;
        }
      }
      else {
        iVar2 = 0x78000000;
        if ((LocalViewPitch <= (int)(uVar4 ^ 0x7fffffff)) &&
           (iVar2 = LocalViewPitch + uVar4, 0x77ffffff < (int)(LocalViewPitch + uVar4))) {
          iVar2 = 0x78000000;
        }
      }
    }
    LocalViewPitch = iVar2;
    if (uVar4 != 0) {
      LocalKeyboardTurner = smooth_mouse.Value;
    }
  }
  return;
}

Assistant:

void G_AddViewPitch (int look)
{
	if (gamestate == GS_TITLELEVEL)
	{
		return;
	}
	look <<= 16;
	if (players[consoleplayer].playerstate != PST_DEAD &&		// No adjustment while dead.
		players[consoleplayer].ReadyWeapon != NULL &&			// No adjustment if no weapon.
		players[consoleplayer].ReadyWeapon->FOVScale > 0)		// No adjustment if it is non-positive.
	{
		look = int(look * players[consoleplayer].ReadyWeapon->FOVScale);
	}
	if (!level.IsFreelookAllowed())
	{
		LocalViewPitch = 0;
	}
	else if (look > 0)
	{
		// Avoid overflowing
		if (LocalViewPitch > INT_MAX - look)
		{
			LocalViewPitch = 0x78000000;
		}
		else
		{
			LocalViewPitch = MIN(LocalViewPitch + look, 0x78000000);
		}
	}
	else if (look < 0)
	{
		// Avoid overflowing
		if (LocalViewPitch < INT_MIN - look)
		{
			LocalViewPitch = -0x78000000;
		}
		else
		{
			LocalViewPitch = MAX(LocalViewPitch + look, -0x78000000);
		}
	}
	if (look != 0)
	{
		LocalKeyboardTurner = smooth_mouse;
	}
}